

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

void aom_ifft_2d_gen(float *input,float *temp,float *output,int n,aom_fft_1d_func_t fft_single,
                    aom_fft_1d_func_t fft_multi,aom_fft_1d_func_t ifft_multi,
                    aom_fft_transpose_func_t transpose,int vec_size)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  code *in_R8;
  code *in_R9;
  code *in_stack_00000008;
  code *in_stack_00000010;
  int in_stack_00000018;
  int y_6;
  int x_6;
  int x_5;
  int x_4;
  int x_3;
  int y_5;
  int x_2;
  int y_4;
  int y_3;
  int x_1;
  int x;
  int y_2;
  int i;
  int y_1;
  int y;
  undefined4 local_f8;
  undefined4 local_bc;
  undefined4 local_a0;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 <= in_ECX / 2; local_34 = local_34 + 1) {
    *(undefined4 *)(in_RDX + (long)(local_34 * in_ECX) * 4) =
         *(undefined4 *)(in_RDI + (long)(local_34 * 2 * in_ECX) * 4);
    *(undefined4 *)(in_RDX + (long)(local_34 * in_ECX + 1) * 4) =
         *(undefined4 *)(in_RDI + (long)((local_34 * in_ECX + in_ECX / 2) * 2) * 4);
  }
  local_38 = in_ECX / 2;
  while (local_38 = local_38 + 1, local_38 < in_ECX) {
    *(undefined4 *)(in_RDX + (long)(local_38 * in_ECX) * 4) =
         *(undefined4 *)(in_RDI + (long)((local_38 - in_ECX / 2) * 2 * in_ECX + 1) * 4);
    *(undefined4 *)(in_RDX + (long)(local_38 * in_ECX + 1) * 4) =
         *(undefined4 *)
          (in_RDI + (long)(((local_38 - in_ECX / 2) * in_ECX + in_ECX / 2) * 2 + 1) * 4);
  }
  for (local_3c = 0; local_3c < 2; local_3c = in_stack_00000018 + local_3c) {
    (*in_stack_00000008)(in_RDX + (long)local_3c * 4,in_RSI + (long)local_3c * 4,in_ECX);
  }
  for (local_40 = 0; local_40 < in_ECX; local_40 = local_40 + 1) {
    for (local_44 = 1; local_44 < in_ECX / 2; local_44 = local_44 + 1) {
      *(undefined4 *)(in_RDX + (long)(local_40 * in_ECX + local_44 + 1) * 4) =
           *(undefined4 *)(in_RDI + (long)((local_40 * in_ECX + local_44) * 2) * 4);
    }
    for (local_48 = 1; local_48 < in_ECX / 2; local_48 = local_48 + 1) {
      *(undefined4 *)(in_RDX + (long)(local_40 * in_ECX + local_48 + in_ECX / 2) * 4) =
           *(undefined4 *)(in_RDI + (long)((local_40 * in_ECX + local_48) * 2 + 1) * 4);
    }
  }
  for (local_4c = 2; local_4c < in_stack_00000018; local_4c = local_4c + 1) {
    (*in_R8)(in_RDX + (long)local_4c * 4,in_RSI + (long)local_4c * 4,in_ECX);
  }
  if (in_stack_00000018 < 2) {
    local_a0 = 2;
  }
  else {
    local_a0 = in_stack_00000018;
  }
  for (local_50 = local_a0; local_50 < in_ECX; local_50 = in_stack_00000018 + local_50) {
    (*in_R9)(in_RDX + (long)local_50 * 4,in_RSI + (long)local_50 * 4,in_ECX);
  }
  for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
    *(undefined4 *)(in_RDX + (long)local_54 * 4) =
         *(undefined4 *)(in_RSI + (long)(local_54 * in_ECX) * 4);
    *(undefined4 *)(in_RDX + (long)((in_ECX / 2) * in_ECX + local_54) * 4) =
         *(undefined4 *)(in_RSI + (long)(local_54 * in_ECX + 1) * 4);
  }
  for (local_58 = 1; local_58 < in_ECX / 2; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c <= in_ECX / 2; local_5c = local_5c + 1) {
      if ((local_5c < 1) || (in_ECX / 2 <= local_5c)) {
        local_bc = 0.0;
      }
      else {
        local_bc = *(float *)(in_RSI + (long)(local_58 + in_ECX / 2 +
                                             (local_5c + in_ECX / 2) * in_ECX) * 4);
      }
      *(float *)(in_RDX + (long)(local_5c + local_58 * in_ECX) * 4) =
           *(float *)(in_RSI + (long)(local_58 + 1 + local_5c * in_ECX) * 4) + local_bc;
    }
    local_60 = in_ECX / 2;
    while (local_60 = local_60 + 1, local_60 < in_ECX) {
      *(float *)(in_RDX + (long)(local_60 + local_58 * in_ECX) * 4) =
           *(float *)(in_RSI + (long)(local_58 + 1 + (in_ECX - local_60) * in_ECX) * 4) -
           *(float *)(in_RSI + (long)(local_58 + in_ECX / 2 +
                                     ((in_ECX - local_60) + in_ECX / 2) * in_ECX) * 4);
    }
    for (local_64 = 0; local_64 <= in_ECX / 2; local_64 = local_64 + 1) {
      if ((local_64 < 1) || (in_ECX / 2 <= local_64)) {
        local_f8 = 0.0;
      }
      else {
        local_f8 = *(float *)(in_RSI + (long)(local_58 + 1 + (local_64 + in_ECX / 2) * in_ECX) * 4);
      }
      *(float *)(in_RDX + (long)(local_64 + (local_58 + in_ECX / 2) * in_ECX) * 4) =
           *(float *)(in_RSI + (long)(local_58 + in_ECX / 2 + local_64 * in_ECX) * 4) - local_f8;
    }
    local_68 = in_ECX / 2;
    while (local_68 = local_68 + 1, local_68 < in_ECX) {
      *(float *)(in_RDX + (long)(local_68 + (local_58 + in_ECX / 2) * in_ECX) * 4) =
           *(float *)(in_RSI + (long)(local_58 + 1 + ((in_ECX - local_68) + in_ECX / 2) * in_ECX) *
                               4) +
           *(float *)(in_RSI + (long)(local_58 + in_ECX / 2 + (in_ECX - local_68) * in_ECX) * 4);
    }
  }
  for (local_6c = 0; local_6c < in_ECX; local_6c = in_stack_00000018 + local_6c) {
    (*in_stack_00000008)(in_RDX + (long)local_6c * 4,in_RSI + (long)local_6c * 4,in_ECX);
  }
  (*in_stack_00000010)(in_RSI,in_RDX,in_ECX);
  return;
}

Assistant:

void aom_ifft_2d_gen(const float *input, float *temp, float *output, int n,
                     aom_fft_1d_func_t fft_single, aom_fft_1d_func_t fft_multi,
                     aom_fft_1d_func_t ifft_multi,
                     aom_fft_transpose_func_t transpose, int vec_size) {
  // Column 0 and n/2 have conjugate symmetry, so we can directly do the ifft
  // and get real outputs.
  for (int y = 0; y <= n / 2; ++y) {
    output[y * n] = input[2 * y * n];
    output[y * n + 1] = input[2 * (y * n + n / 2)];
  }
  for (int y = n / 2 + 1; y < n; ++y) {
    output[y * n] = input[2 * (y - n / 2) * n + 1];
    output[y * n + 1] = input[2 * ((y - n / 2) * n + n / 2) + 1];
  }

  for (int i = 0; i < 2; i += vec_size) {
    ifft_multi(output + i, temp + i, n);
  }

  // For the other columns, since we don't have a full ifft for complex inputs
  // we have to split them into the real and imaginary counterparts.
  // Pack the real component, then the imaginary components.
  for (int y = 0; y < n; ++y) {
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + 1)] = input[2 * (y * n + x)];
    }
    for (int x = 1; x < n / 2; ++x) {
      output[y * n + (x + n / 2)] = input[2 * (y * n + x) + 1];
    }
  }
  for (int y = 2; y < vec_size; y++) {
    fft_single(output + y, temp + y, n);
  }
  // This is the part that can be sped up with SIMD
  for (int y = AOMMAX(2, vec_size); y < n; y += vec_size) {
    fft_multi(output + y, temp + y, n);
  }

  // Put the 0 and n/2 th results in the correct place.
  for (int x = 0; x < n; ++x) {
    output[x] = temp[x * n];
    output[(n / 2) * n + x] = temp[x * n + 1];
  }
  // This rearranges and transposes.
  for (int y = 1; y < n / 2; ++y) {
    // Fill in the real columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + y * n] =
          temp[(y + 1) + x * n] +
          ((x > 0 && x < n / 2) ? temp[(y + n / 2) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + y * n] = temp[(y + 1) + (n - x) * n] -
                          temp[(y + n / 2) + ((n - x) + n / 2) * n];
    }
    // Fill in the imag columns
    for (int x = 0; x <= n / 2; ++x) {
      output[x + (y + n / 2) * n] =
          temp[(y + n / 2) + x * n] -
          ((x > 0 && x < n / 2) ? temp[(y + 1) + (x + n / 2) * n] : 0);
    }
    for (int x = n / 2 + 1; x < n; ++x) {
      output[x + (y + n / 2) * n] = temp[(y + 1) + ((n - x) + n / 2) * n] +
                                    temp[(y + n / 2) + (n - x) * n];
    }
  }
  for (int y = 0; y < n; y += vec_size) {
    ifft_multi(output + y, temp + y, n);
  }
  transpose(temp, output, n);
}